

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrumTAP.cpp
# Opt level: O0

Pulse __thiscall Storage::Tape::ZXSpectrumTAP::virtual_get_next_pulse(ZXSpectrumTAP *this)

{
  Phase PVar1;
  Pulse PVar2;
  uint8_t uVar3;
  int iVar4;
  Time local_4c;
  Time local_44;
  Time local_3c;
  Time local_34;
  undefined1 local_2c [8];
  Pulse pulse;
  ZXSpectrumTAP *this_local;
  uint uStack_10;
  Pulse gap;
  
  pulse.length = (Time)this;
  Tape::Pulse::Pulse((Pulse *)local_2c);
  local_2c._0_4_ = ZEXT14((this->distance_into_phase_ & 1U) == 0);
  PVar1 = this->phase_;
  if (PVar1 == PilotTone) {
    Time::Time(&local_34,0x10f,0x6acfc);
    local_2c._4_4_ = local_34.length;
    pulse.type = local_34.clock_rate;
    this->distance_into_phase_ = this->distance_into_phase_ + 1;
    iVar4 = 0xc97;
    if (this->block_type_ != '\0') {
      iVar4 = 0x1f7f;
    }
    if (iVar4 <= this->distance_into_phase_) {
      if ((this->distance_into_phase_ & 1U) == 0) {
        Time::Time(&local_3c,0x2df,3500000);
      }
      else {
        Time::Time(&local_3c,0x29b,3500000);
      }
      local_2c._4_4_ = local_3c.length;
      pulse.type = local_3c.clock_rate;
      iVar4 = 0xc98;
      if (this->block_type_ != '\0') {
        iVar4 = 0x1f80;
      }
      if (this->distance_into_phase_ == iVar4) {
        this->distance_into_phase_ = 0;
        this->phase_ = Data;
      }
    }
  }
  else if (PVar1 == Data) {
    if ((this->data_byte_ & 0x80) == 0) {
      Time::Time(&local_44,0x357,3500000);
    }
    else {
      Time::Time(&local_44,0x6ae,3500000);
    }
    local_2c._4_4_ = local_44.length;
    pulse.type = local_44.clock_rate;
    this->distance_into_phase_ = this->distance_into_phase_ + 1;
    if ((this->distance_into_phase_ & 1U) == 0) {
      this->data_byte_ = this->data_byte_ << 1;
    }
    if ((this->distance_into_phase_ & 0xfU) == 0) {
      if (this->distance_into_phase_ >> 4 == (uint)this->block_length_) {
        if (this->block_type_ == '\0') {
          read_next_block(this);
        }
        else {
          this->distance_into_phase_ = 0;
          this->phase_ = Gap;
        }
      }
      else {
        uVar3 = FileHolder::get8(&this->file_);
        this->data_byte_ = uVar3;
      }
    }
  }
  else if (PVar1 == Gap) {
    Tape::Pulse::Pulse((Pulse *)((long)&this_local + 4));
    this_local._4_4_ = Zero;
    Time::Time(&local_4c,1);
    uStack_10 = local_4c.length;
    gap.type = local_4c.clock_rate;
    read_next_block(this);
    goto LAB_009b649f;
  }
  this_local._4_4_ = local_2c._0_4_;
  uStack_10 = local_2c._4_4_;
  gap.type = pulse.type;
LAB_009b649f:
  PVar2.length.length = uStack_10;
  PVar2.type = this_local._4_4_;
  PVar2.length.clock_rate = gap.type;
  return PVar2;
}

Assistant:

Tape::Pulse ZXSpectrumTAP::virtual_get_next_pulse() {
	// Adopt a general pattern of high then low.
	Pulse pulse;
	pulse.type = (distance_into_phase_ & 1) ? Pulse::Type::High : Pulse::Type::Low;

	switch(phase_) {
		default: break;

		case Phase::PilotTone: {
			// Output: pulses of length 2168;
			// 8063 pulses if block type is 0, otherwise 3223;
			// then a 667-length pulse followed by a 735-length pulse.

			pulse.length = Time(271, 437'500);	// i.e. 2168 / 3'500'000
			++distance_into_phase_;

			// Check whether in the last two.
			if(distance_into_phase_ >= (block_type_ ? 8063 : 3223)) {
				pulse.length = (distance_into_phase_ & 1) ? Time(667, 3'500'000) : Time(735, 3'500'000);

				// Check whether this is the last one.
				if(distance_into_phase_ == (block_type_ ? 8064 : 3224)) {
					distance_into_phase_ = 0;
					phase_ = Phase::Data;
				}
			}
		} break;

		case Phase::Data: {
			// Output two pulses of length 855 for a 0; two of length 1710 for a 1,
			// from MSB to LSB.
			pulse.length = (data_byte_ & 0x80) ? Time(1710, 3'500'000) : Time(855, 3'500'000);
			++distance_into_phase_;

			if(!(distance_into_phase_ & 1)) {
				data_byte_ <<= 1;
			}

			if(!(distance_into_phase_ & 15)) {
				if((distance_into_phase_ >> 4) == block_length_) {
					if(block_type_) {
						distance_into_phase_ = 0;
						phase_ = Phase::Gap;
					} else {
						read_next_block();
					}
				} else {
					data_byte_ = file_.get8();
				}
			}
		} break;

		case Phase::Gap:
			Pulse gap;
			gap.type = Pulse::Type::Zero;
			gap.length = Time(1);

			read_next_block();
		return gap;
	}

	return pulse;
}